

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O2

void Abc_NtkCheckAbsorb(Abc_Ntk_t *pNtk,int nLutSize)

{
  int *piVar1;
  Abc_Obj_t *pPivot;
  int iVar2;
  abctime aVar3;
  void *__s;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  abctime aVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  aVar3 = Abc_Clock();
  iVar8 = pNtk->vObjs->nSize;
  iVar2 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar2 = iVar8;
  }
  iVar9 = 0;
  if (iVar2 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar2 << 2);
  }
  memset(__s,0,(long)iVar8 * 4);
  p = Vec_PtrAlloc(100);
  uVar7 = 0;
  for (; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar9);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      for (lVar10 = 0; lVar10 < (pAVar4->vFanins).nSize; lVar10 = lVar10 + 1) {
        pPivot = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar10]];
        if (((*(uint *)&pPivot->field_0x14 & 0xf) == 7) &&
           (iVar2 = Abc_ObjCheckAbsorb(pAVar4,pPivot,nLutSize,p), iVar2 != 0)) {
          iVar2 = pPivot->Id;
          if (((long)iVar2 < 0) || (iVar8 <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar1 = (int *)((long)__s + (long)iVar2 * 4);
          *piVar1 = *piVar1 + 1;
          uVar7 = uVar7 + 1;
        }
      }
    }
  }
  Vec_PtrFree(p);
  iVar2 = 0;
  uVar6 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar2) {
      iVar8 = 0x6ae8bc;
      printf("Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ",
             ((double)(int)uVar7 * 100.0) / (double)pNtk->nObjCounts[7],
             ((double)(int)uVar6 * 100.0) / (double)pNtk->nObjCounts[7],(ulong)uVar7,(ulong)uVar6);
      aVar5 = Abc_Clock();
      Abc_Print(iVar8,"%s =","Time");
      Abc_Print(iVar8,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
      return;
    }
    pAVar4 = Abc_NtkObj(pNtk,iVar2);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      iVar9 = pAVar4->Id;
      if (((long)iVar9 < 0) || (iVar8 <= iVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar6 = uVar6 + (*(int *)((long)__s + (long)iVar9 * 4) == (pAVar4->vFanouts).nSize);
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Abc_NtkCheckAbsorb( Abc_Ntk_t * pNtk, int nLutSize )
{
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    vCounts = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vFanins = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    Abc_ObjForEachFanin( pObj, pFanin, k )
        if ( Abc_ObjIsNode(pFanin) && Abc_ObjCheckAbsorb( pObj, pFanin, nLutSize, vFanins ) )
        {
            Vec_IntAddToEntry( vCounts, Abc_ObjId(pFanin), 1 );
            Counter++;
        }
    Vec_PtrFree( vFanins );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Vec_IntEntry(vCounts, Abc_ObjId(pObj)) == Abc_ObjFanoutNum(pObj) )
        {
//            printf( "%d ", Abc_ObjId(pObj) );
            Counter2++;
        }
    printf( "Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ", 
        Counter,  100.0 * Counter  / Abc_NtkNodeNum(pNtk), 
        Counter2, 100.0 * Counter2 / Abc_NtkNodeNum(pNtk) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}